

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O2

int ddSiftingBackward(DdManager *table,int size,Move *moves)

{
  int iVar1;
  Move *pMVar2;
  
  for (pMVar2 = moves; pMVar2 != (Move *)0x0; pMVar2 = pMVar2->next) {
    if (pMVar2->size < size) {
      size = pMVar2->size;
    }
  }
  while( true ) {
    if (moves == (Move *)0x0) {
      return 1;
    }
    if (moves->size == size) break;
    iVar1 = cuddSwapInPlace(table,moves->x,moves->y);
    if (iVar1 == 0) {
      return 0;
    }
    moves = moves->next;
  }
  return 1;
}

Assistant:

static int
ddSiftingBackward(
  DdManager * table,
  int  size,
  Move * moves)
{
    Move *move;
    int res;

    for (move = moves; move != NULL; move = move->next) {
        if (move->size < size) {
            size = move->size;
        }
    }

    for (move = moves; move != NULL; move = move->next) {
        if (move->size == size) return(1);
        res = cuddSwapInPlace(table,(int)move->x,(int)move->y);
        if (!res) return(0);
    }

    return(1);

}